

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

bool __thiscall
QItemSelectionRangeRefCache::contains
          (QItemSelectionRangeRefCache *this,int row,int column,QModelIndex *parentIndex)

{
  int iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_top < -1) {
    iVar1 = QPersistentModelIndex::row(&this->m_range->tl);
    this->m_top = iVar1;
    iVar1 = QPersistentModelIndex::column(&this->m_range->tl);
    this->m_left = iVar1;
    iVar1 = QPersistentModelIndex::row(&this->m_range->br);
    this->m_bottom = iVar1;
    iVar1 = QPersistentModelIndex::column(&this->m_range->br);
    this->m_right = iVar1;
  }
  bVar2 = false;
  if ((((row <= this->m_bottom) && (bVar2 = false, column <= this->m_right)) &&
      (bVar2 = false, this->m_top <= row)) && (this->m_left <= column)) {
    if ((this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
        super__Optional_payload_base<QModelIndex>._M_engaged == false) {
      QPersistentModelIndex::parent(&local_48,&this->m_range->tl);
      bVar2 = (this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
              super__Optional_payload_base<QModelIndex>._M_engaged;
      (this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
      super__Optional_payload_base<QModelIndex>._M_payload._M_value.m.ptr = local_48.m.ptr;
      *(undefined8 *)
       &(this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
        super__Optional_payload_base<QModelIndex>._M_payload = local_48._0_8_;
      (this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
      super__Optional_payload_base<QModelIndex>._M_payload._M_value.i = local_48.i;
      if (bVar2 == false) {
        (this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
        super__Optional_payload_base<QModelIndex>._M_engaged = true;
      }
    }
    if ((this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
        super__Optional_payload_base<QModelIndex>._M_engaged == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        contains();
      }
      goto LAB_004716f7;
    }
    if ((((this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
          super__Optional_payload_base<QModelIndex>._M_payload._M_value.r == parentIndex->r) &&
        ((this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
         super__Optional_payload_base<QModelIndex>._M_payload._M_value.c == parentIndex->c)) &&
       ((this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
        super__Optional_payload_base<QModelIndex>._M_payload._M_value.i == parentIndex->i)) {
      bVar2 = (this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
              super__Optional_payload_base<QModelIndex>._M_payload._M_value.m.ptr ==
              (parentIndex->m).ptr;
    }
    else {
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
LAB_004716f7:
  __stack_chk_fail();
}

Assistant:

inline bool contains(int row, int column, const QModelIndex &parentIndex)
    {
        populate();
        return (m_bottom >= row && m_right >= column &&
                m_top    <= row && m_left  <= column &&
                parent() == parentIndex);
    }